

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error fp_rounding<50>(context *ctx,token *token,opcode *op)

{
  opcode *in_RCX;
  uint64_t bits;
  string_view prefix;
  optional<unsigned_long> oVar1;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar1 = find_in_table((token *)op,fp_rounding<50>::table,prefix);
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    context::tokenize(&local_58,(context *)token);
    *(int *)&op[2].value = local_58.column;
    op[1].value = (uint64_t)local_58.data.string._M_str;
    op[1].reuse = local_58.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
    op->value = (uint64_t)local_58.filename;
    op->reuse = local_58.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
  }
  bits = 0;
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    bits = oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload << 0x32;
  }
  opcode::add_bits(in_RCX,bits);
  ctx->pc = 0;
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(bop)
{
    static const char* table[] = {"AND", "OR", "XOR", "INVALIDBOP3", nullptr};
    const std::optional<int64_t> value = find_in_table(token, table, ".");
    if (!value) {
        return fail(token, "expected .AND, .OR or .XOR");
    }
    op.add_bits(*value << address);
    token = ctx.tokenize();
    return {};
}